

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::form::~form(form *this)

{
  pointer ppVar1;
  uint uVar2;
  ulong uVar3;
  
  (this->super_base_form)._vptr_base_form = (_func_int **)&PTR_render_002b47c8;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppVar1 = (this->elements_).
             super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->elements_).
                      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <= uVar3)
    break;
    if ((ppVar1[uVar3].second == true) && (ppVar1[uVar3].first != (base_form *)0x0)) {
      (*(ppVar1[uVar3].first)->_vptr_base_form[7])();
    }
    uVar2 = uVar2 + 1;
  }
  booster::hold_ptr<cppcms::form::_data>::~hold_ptr(&this->d);
  std::
  _Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  ::~_Vector_base(&(this->elements_).
                   super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                 );
  return;
}

Assistant:

form::~form()
{
	for(unsigned i=0;i<elements_.size();i++) {
		if(elements_[i].second)
			delete elements_[i].first;
	}
}